

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O2

bool Memory::RecyclerHeuristic::PartialConcurrentNextCollection
               (double ratio,ConfigFlagsTable *flags)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Js::Phases::IsEnabled(&flags->Force,ConcurrentPartialCollectPhase);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = Js::Phases::IsEnabled(&flags->Off,ConcurrentPartialCollectPhase);
    bVar2 = !bVar1 && 0.5 <= ratio;
  }
  return bVar2;
}

Assistant:

bool
RecyclerHeuristic::PartialConcurrentNextCollection(double ratio, Js::ConfigFlagsTable& flags)
{
    if (CUSTOM_PHASE_FORCE1(flags, Js::ConcurrentPartialCollectPhase))
    {
        return true;
    }

    if (RECYCLER_HEURISTIC_VERSION == 10)
    {
        // Default off for version == 10
        if (!CUSTOM_PHASE_ON1(flags, Js::ConcurrentPartialCollectPhase))
        {
            return false;
        }
    }
    else
    {
        // Default on
        if (CUSTOM_PHASE_OFF1(flags, Js::ConcurrentPartialCollectPhase))
        {
            return false;
        }
    }
    return ratio >= 0.5;
}